

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> __thiscall
testing::internal::ReturnAction::operator_cast_to_Action(ReturnAction *this)

{
  Impl<cv::Mat,_cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this_00;
  linked_ptr_internal extraout_RDX;
  linked_ptr<cv::Mat> *in_RSI;
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> AVar1;
  ReturnAction<cv::Mat> *this_local;
  
  this_00 = (Impl<cv::Mat,_cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)operator_new(200);
  ReturnAction<cv::Mat>::Impl<cv::Mat,_cv::Mat_(cv::Mat,_cv::Rect_<int>)>::Impl(this_00,in_RSI);
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::Action
            ((Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)this,
             (ActionInterface<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)this_00);
  AVar1.impl_.link_.next_ = extraout_RDX.next_;
  AVar1.impl_.value_ = (ActionInterface<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)this;
  return (Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>)AVar1.impl_;
}

Assistant:

operator Action<F>() const {
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    return Action<F>(new Impl<R, F>(value_));
  }